

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureHandler.cxx
# Opt level: O0

int __thiscall cmCTestConfigureHandler::ProcessHandler(cmCTestConfigureHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  string local_1478 [32];
  undefined1 local_1458 [8];
  ostringstream cmCTestLog_msg_7;
  string local_12e0 [32];
  undefined1 local_12c0 [8];
  ostringstream cmCTestLog_msg_6;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1148;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1140;
  duration<long,_std::ratio<60L,_1L>_> local_1138;
  rep local_1130;
  allocator<char> local_1121;
  string local_1120;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1100;
  allocator<char> local_10f1;
  string local_10f0;
  string local_10d0;
  allocator<char> local_10a9;
  string local_10a8;
  allocator<char> local_1081;
  string local_1080;
  allocator<char> local_1059;
  string local_1058;
  string local_1038 [32];
  undefined1 local_1018 [8];
  ostringstream cmCTestLog_msg_5;
  allocator<char> local_e99;
  string local_e98;
  allocator<char> local_e71;
  string local_e70;
  allocator<char> local_e49;
  string local_e48;
  allocator<char> local_e21;
  string local_e20;
  undefined1 local_e00 [8];
  cmXMLWriter xml;
  string local_da0 [32];
  undefined1 local_d80 [8];
  ostringstream cmCTestLog_msg_4;
  undefined1 local_c08 [8];
  cmGeneratedFileStream ofs;
  time_point start_time_time;
  string start_time;
  undefined1 local_978 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_800 [8];
  cmGeneratedFileStream os;
  int res;
  int retVal;
  string output;
  time_point elapsed_time_start;
  undefined1 local_568 [8];
  ostringstream cmCTestLog_msg_2;
  allocator<char> local_3e9;
  string local_3e8;
  undefined1 local_3c8 [8];
  string buildDirectory;
  string local_3a0 [32];
  undefined1 local_380 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_201;
  string local_200;
  undefined1 local_1e0 [8];
  string cCommand;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestConfigureHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"Configure project");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
               ,0x1a,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)(cCommand.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_190);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"ConfigureCommand",&local_201);
  cmCTest::GetCTestConfiguration((string *)local_1e0,pcVar1,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
    poVar3 = std::operator<<((ostream *)local_380,
                             "Cannot find ConfigureCommand key in the DartConfiguration.tcl");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x20,pcVar4,false);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
    this_local._4_4_ = -1;
    buildDirectory.field_2._12_4_ = 1;
    goto LAB_00187c02;
  }
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"BuildDirectory",&local_3e9);
  cmCTest::GetCTestConfiguration((string *)local_3c8,pcVar1,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    output.field_2._8_8_ = std::chrono::_V2::steady_clock::now();
    std::__cxx11::string::string((string *)&res);
    os._580_4_ = 0;
    os._576_4_ = 0;
    bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12c0);
      poVar3 = std::operator<<((ostream *)local_12c0,"Configure with command: ");
      poVar3 = std::operator<<(poVar3,(string *)local_1e0);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,0x5f,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_12e0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12c0);
LAB_00187a9d:
      if ((os._576_4_ == 0) || (os._580_4_ != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1458);
        poVar3 = std::operator<<((ostream *)local_1458,"Error(s) when configuring the project");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,99,pcVar4,false);
        std::__cxx11::string::~string(local_1478);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1458);
        this_local._4_4_ = -1;
        buildDirectory.field_2._12_4_ = 1;
      }
      else {
        this_local._4_4_ = 0;
        buildDirectory.field_2._12_4_ = 1;
      }
    }
    else {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_800,None);
      bVar2 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartConfigure,"Configure",
                         (cmGeneratedFileStream *)local_800);
      if (bVar2) {
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)&start_time_time,(this->super_cmCTestGenericHandler).CTest);
        ofs._576_8_ = std::chrono::_V2::system_clock::now();
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_c08,None);
        cmCTestGenericHandler::StartLogFile
                  (&this->super_cmCTestGenericHandler,"Configure",(cmGeneratedFileStream *)local_c08
                  );
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d80);
        poVar3 = std::operator<<((ostream *)local_d80,"Configure with command: ");
        poVar3 = std::operator<<(poVar3,(string *)local_1e0);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x3f,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_da0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d80);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        xml._80_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        os._576_4_ = cmCTest::RunMakeCommand
                               (pcVar1,(string *)local_1e0,(string *)&res,(int *)&os.field_0x244,
                                pcVar4,(cmDuration)xml._80_8_,(ostream *)local_c08,Auto);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(local_c08 + (long)*(_func_int **)((long)local_c08 + -0x18)));
        if (bVar2) {
          std::ofstream::close();
        }
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(local_800 + (long)*(_func_int **)((long)local_800 + -0x18)));
        if (bVar2) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_e00,(ostream *)local_800,0);
          cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_e00,
                            (bool)((this->super_cmCTestGenericHandler).AppendXML & 1));
          cmCTest::GenerateSubprojectsOutput
                    ((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_e00);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e20,"Configure",&local_e21);
          cmXMLWriter::StartElement((cmXMLWriter *)local_e00,&local_e20);
          std::__cxx11::string::~string((string *)&local_e20);
          std::allocator<char>::~allocator(&local_e21);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e48,"StartDateTime",&local_e49);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_e00,&local_e48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &start_time_time);
          std::__cxx11::string::~string((string *)&local_e48);
          std::allocator<char>::~allocator(&local_e49);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e70,"StartConfigureTime",&local_e71);
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((cmXMLWriter *)local_e00,&local_e70,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&ofs.field_0x240);
          std::__cxx11::string::~string((string *)&local_e70);
          std::allocator<char>::~allocator(&local_e71);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e98,"ConfigureCommand",&local_e99);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_e00,&local_e98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0)
          ;
          std::__cxx11::string::~string((string *)&local_e98);
          std::allocator<char>::~allocator(&local_e99);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1018);
          poVar3 = std::operator<<((ostream *)local_1018,"End");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                       ,0x50,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1038);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1018);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1058,"Log",&local_1059);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_e00,&local_1058,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res);
          std::__cxx11::string::~string((string *)&local_1058);
          std::allocator<char>::~allocator(&local_1059);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1080,"ConfigureStatus",&local_1081);
          cmXMLWriter::Element<int>((cmXMLWriter *)local_e00,&local_1080,(int *)&os.field_0x244);
          std::__cxx11::string::~string((string *)&local_1080);
          std::allocator<char>::~allocator(&local_1081);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_10a8,"EndDateTime",&local_10a9);
          cmCTest::CurrentTime_abi_cxx11_(&local_10d0,(this->super_cmCTestGenericHandler).CTest);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_e00,&local_10a8,&local_10d0);
          std::__cxx11::string::~string((string *)&local_10d0);
          std::__cxx11::string::~string((string *)&local_10a8);
          std::allocator<char>::~allocator(&local_10a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_10f0,"EndConfigureTime",&local_10f1);
          local_1100.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((cmXMLWriter *)local_e00,&local_10f0,&local_1100);
          std::__cxx11::string::~string((string *)&local_10f0);
          std::allocator<char>::~allocator(&local_10f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1120,"ElapsedMinutes",&local_1121);
          local_1148.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
          local_1140.__r =
               (rep)std::chrono::operator-
                              (&local_1148,
                               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)((long)&output.field_2 + 8));
          local_1138.__r =
               (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1000000000l>>
                              (&local_1140);
          local_1130 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_1138);
          cmXMLWriter::Element<long>((cmXMLWriter *)local_e00,&local_1120,&local_1130);
          std::__cxx11::string::~string((string *)&local_1120);
          std::allocator<char>::~allocator(&local_1121);
          cmXMLWriter::EndElement((cmXMLWriter *)local_e00);
          cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_e00);
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_e00);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_c08);
        std::__cxx11::string::~string((string *)&start_time_time);
        buildDirectory.field_2._12_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_978);
        poVar3 = std::operator<<((ostream *)local_978,"Cannot open configure file");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x35,pcVar4,false);
        std::__cxx11::string::~string((string *)(start_time.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_978);
        this_local._4_4_ = 1;
        buildDirectory.field_2._12_4_ = 1;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_800);
      if (buildDirectory.field_2._12_4_ == 0) goto LAB_00187a9d;
    }
    std::__cxx11::string::~string((string *)&res);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_568);
    poVar3 = std::operator<<((ostream *)local_568,
                             "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x29,pcVar4,false);
    std::__cxx11::string::~string((string *)&elapsed_time_start);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_568);
    this_local._4_4_ = -1;
    buildDirectory.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_3c8);
LAB_00187c02:
  std::__cxx11::string::~string((string *)local_1e0);
  return this_local._4_4_;
}

Assistant:

int cmCTestConfigureHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "Configure project" << std::endl, this->Quiet);
  std::string cCommand =
    this->CTest->GetCTestConfiguration("ConfigureCommand");
  if (cCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find ConfigureCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  auto elapsed_time_start = std::chrono::steady_clock::now();
  std::string output;
  int retVal = 0;
  int res = 0;
  if (!this->CTest->GetShowOnly()) {
    cmGeneratedFileStream os;
    if (!this->StartResultingXML(cmCTest::PartConfigure, "Configure", os)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open configure file" << std::endl);
      return 1;
    }
    std::string start_time = this->CTest->CurrentTime();
    auto start_time_time = std::chrono::system_clock::now();

    cmGeneratedFileStream ofs;
    this->StartLogFile("Configure", ofs);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
    res = this->CTest->RunMakeCommand(cCommand, output, &retVal,
                                      buildDirectory.c_str(),
                                      cmDuration::zero(), ofs);

    if (ofs) {
      ofs.close();
    }

    if (os) {
      cmXMLWriter xml(os);
      this->CTest->StartXML(xml, this->AppendXML);
      this->CTest->GenerateSubprojectsOutput(xml);
      xml.StartElement("Configure");
      xml.Element("StartDateTime", start_time);
      xml.Element("StartConfigureTime", start_time_time);
      xml.Element("ConfigureCommand", cCommand);
      cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
      xml.Element("Log", output);
      xml.Element("ConfigureStatus", retVal);
      xml.Element("EndDateTime", this->CTest->CurrentTime());
      xml.Element("EndConfigureTime", std::chrono::system_clock::now());
      xml.Element("ElapsedMinutes",
                  std::chrono::duration_cast<std::chrono::minutes>(
                    std::chrono::steady_clock::now() - elapsed_time_start)
                    .count());
      xml.EndElement(); // Configure
      this->CTest->EndXML(xml);
    }
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
  }
  if (!res || retVal) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when configuring the project" << std::endl);
    return -1;
  }
  return 0;
}